

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_pushbool(HSQUIRRELVM v,SQBool b)

{
  long in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectPtr local_20 [2];
  
  SQObjectPtr::SQObjectPtr(local_20,in_RSI != 0);
  SQVM::Push(in_RDI,in_stack_ffffffffffffffb8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  return;
}

Assistant:

void sq_pushbool(HSQUIRRELVM v,SQBool b)
{
    v->Push(b?true:false);
}